

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

int cgltf_parse_json_string_array
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,char ***out_array,
              cgltf_size *out_size)

{
  int i_00;
  ulong uVar1;
  long lVar2;
  
  if (tokens[(uint)i].type == JSMN_ARRAY) {
    i_00 = cgltf_parse_json_array
                     (options,tokens,i,(uint8_t *)0x8,(size_t)out_array,(void **)out_size,
                      (cgltf_size *)json_chunk);
    if (-1 < i_00) {
      uVar1 = 0xffffffffffffffff;
      lVar2 = 0;
      do {
        uVar1 = uVar1 + 1;
        if (*out_size <= uVar1) {
          return i_00;
        }
        i_00 = cgltf_parse_json_string
                         (options,tokens,i_00,json_chunk,(char **)(lVar2 + (long)*out_array));
        lVar2 = lVar2 + 8;
      } while (-1 < i_00);
    }
  }
  else {
    i_00 = -1;
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_string_array(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, char*** out_array, cgltf_size* out_size)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_ARRAY);
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(char*), (void**)out_array, out_size);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < *out_size; ++j)
	{
		i = cgltf_parse_json_string(options, tokens, i, json_chunk, j + (*out_array));
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}